

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::render
               (TestContext *testContext,RenderContext *renderContext,
               TextureRenderer *textureRenderer,ResultCollector *results,Random *rng,deUint32 name,
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *data,ImageInfo *info,Verify verify)

{
  deUint32 dVar1;
  int iVar2;
  TestLog *log;
  undefined8 uVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  int i;
  int iVar7;
  TextureChannelClass TVar8;
  CompressedTexFormat format_00;
  ContextType ctxType;
  GLenum GVar9;
  int iVar10;
  CubeFace CVar11;
  undefined4 extraout_var;
  ContextInfo *this;
  ulong uVar13;
  ObjectTraits *traits;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int *piVar17;
  int faceNdx;
  long lVar18;
  Vector<int,_4> res_1;
  Framebuffer framebuffer;
  size_type __dnew;
  TextureLevel renderbuffer;
  Vector<int,_4> res_2;
  Vector<float,_4> res_3;
  TextureFormat readPixelsFormat;
  TextureFormat format;
  ConstPixelBufferAccess refRenderbuffer;
  long alStack_210 [3];
  IVec4 srcBits;
  undefined1 local_1e8 [32];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_1c8;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_1b0;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_198;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_180 [11];
  Vec4 threshold_2;
  Vector<int,_4> res;
  int aiStack_50 [4];
  int aiStack_40 [4];
  Functions *pFVar12;
  
  dVar1 = info->m_target;
  if ((int)dVar1 < 0x8513) {
    if (dVar1 == 0xde1) {
      bVar6 = glu::isCompressedFormat(info->m_format);
      if (!bVar6) {
        getLevelAccesses((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          *)&srcBits,data,info);
        refRenderbuffer.m_format.order =
             (int)((ulong)(srcBits.m_data._8_8_ - srcBits.m_data._0_8_) >> 3) * -0x33333333;
        refRenderbuffer.m_size.m_data[0] = srcBits.m_data[0];
        refRenderbuffer.m_size.m_data[1] = srcBits.m_data[1];
        renderTexture2DView(testContext,renderContext,textureRenderer,results,rng,name,info,
                            (Texture2DView *)&refRenderbuffer,verify);
        goto LAB_0168d21b;
      }
      srcBits.m_data[0] = 0;
      srcBits.m_data[1] = 0;
      srcBits.m_data[2] = 0;
      srcBits.m_data[3] = 0;
      local_1e8._0_8_ = (pointer)0x0;
      refRenderbuffer.m_size.m_data[2] = 0;
      refRenderbuffer.m_pitch.m_data[0] = 0;
      refRenderbuffer.m_format.order = R;
      refRenderbuffer.m_format.type = SNORM_INT8;
      refRenderbuffer.m_size.m_data[0] = 0;
      refRenderbuffer.m_size.m_data[1] = 0;
      decompressTexture((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                         *)&srcBits,
                        (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                        &refRenderbuffer,renderContext,info,data);
      renderbuffer.m_format.order =
           (int)((ulong)(refRenderbuffer.m_size.m_data._0_8_ - (long)refRenderbuffer.m_format) >> 3)
           * -0x33333333;
      renderbuffer.m_size.m_data[0] = refRenderbuffer.m_format.order;
      renderbuffer.m_size.m_data[1] = refRenderbuffer.m_format.type;
      renderTexture2DView(testContext,renderContext,textureRenderer,results,rng,name,info,
                          (Texture2DView *)&renderbuffer,verify);
      if (refRenderbuffer.m_format != (TextureFormat)0x0) {
        operator_delete((void *)refRenderbuffer.m_format,
                        refRenderbuffer._16_8_ - (long)refRenderbuffer.m_format);
      }
    }
    else {
      if (dVar1 != 0x806f) {
        return;
      }
      bVar6 = glu::isCompressedFormat(info->m_format);
      if (!bVar6) {
        getLevelAccesses((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          *)&srcBits,data,info);
        tcu::Texture3DView::Texture3DView
                  ((Texture3DView *)&refRenderbuffer,
                   (int)((ulong)(srcBits.m_data._8_8_ - srcBits.m_data._0_8_) >> 3) * -0x33333333,
                   (ConstPixelBufferAccess *)srcBits.m_data._0_8_);
        renderTexture3DView(testContext,renderContext,textureRenderer,results,rng,name,info,
                            (Texture3DView *)&refRenderbuffer,verify);
LAB_0168d21b:
        if (srcBits.m_data._0_8_ == 0) {
          return;
        }
        operator_delete((void *)srcBits.m_data._0_8_,local_1e8._0_8_ - srcBits.m_data._0_8_);
        return;
      }
      srcBits.m_data[0] = 0;
      srcBits.m_data[1] = 0;
      srcBits.m_data[2] = 0;
      srcBits.m_data[3] = 0;
      local_1e8._0_8_ = (pointer)0x0;
      refRenderbuffer.m_size.m_data[2] = 0;
      refRenderbuffer.m_pitch.m_data[0] = 0;
      refRenderbuffer.m_format.order = R;
      refRenderbuffer.m_format.type = SNORM_INT8;
      refRenderbuffer.m_size.m_data[0] = 0;
      refRenderbuffer.m_size.m_data[1] = 0;
      decompressTexture((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                         *)&srcBits,
                        (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                        &refRenderbuffer,renderContext,info,data);
      tcu::Texture3DView::Texture3DView
                ((Texture3DView *)&renderbuffer,
                 (int)((ulong)(refRenderbuffer.m_size.m_data._0_8_ - (long)refRenderbuffer.m_format)
                      >> 3) * -0x33333333,(ConstPixelBufferAccess *)refRenderbuffer.m_format);
      renderTexture3DView(testContext,renderContext,textureRenderer,results,rng,name,info,
                          (Texture3DView *)&renderbuffer,verify);
      if (refRenderbuffer.m_format != (TextureFormat)0x0) {
        operator_delete((void *)refRenderbuffer.m_format,
                        refRenderbuffer._16_8_ - (long)refRenderbuffer.m_format);
      }
    }
LAB_0168cd4f:
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::~vector((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *)&srcBits);
    return;
  }
  if (dVar1 == 0x8513) {
    bVar6 = glu::isCompressedFormat(info->m_format);
    if (bVar6) {
      format_00 = glu::mapGLCompressedTexFormat(info->m_format);
      res_2.m_data[0] = format_00;
      res_3.m_data._0_8_ = tcu::getUncompressedFormat(format_00);
      iVar7 = getTexelBlockSize(info->m_format);
      getTexelBlockPixelSize((anon_unknown_0 *)&__dnew,info->m_format);
      ctxType.super_ApiType.m_bits =
           (ApiType)(*renderContext->_vptr_RenderContext[2])(renderContext);
      bVar6 = glu::contextSupports(ctxType,(ApiType)0x23);
      memset(&srcBits,0,0x90);
      memset(&refRenderbuffer,0,0x90);
      this = glu::ContextInfo::create(renderContext);
      res_1.m_data[0] = 2;
      bVar5 = tcu::isAstcFormat(format_00);
      if (bVar5) {
        bVar5 = glu::ContextInfo::isExtensionSupported(this,"GL_KHR_texture_compression_astc_hdr");
        if ((!bVar5) || (bVar5 = tcu::isAstcSRGBFormat(format_00), bVar5)) {
          if ((bVar6) ||
             (bVar6 = glu::ContextInfo::isExtensionSupported
                                (this,"GL_KHR_texture_compression_astc_ldr"), bVar6)) {
            res_1.m_data[0] = 0;
          }
        }
        else {
          res_1.m_data[0] = 1;
        }
      }
      lVar15 = 0;
      do {
        iVar10 = getLevelCount(info);
        std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
                  ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                   ((long)srcBits.m_data + lVar15),(long)iVar10);
        iVar10 = getLevelCount(info);
        std::
        vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        ::resize((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                  *)((long)refRenderbuffer.m_size.m_data + lVar15 + -8),(long)iVar10);
        lVar15 = lVar15 + 0x18;
      } while (lVar15 != 0x90);
      iVar10 = getLevelCount(info);
      if (0 < iVar10) {
        lVar15 = 0;
        do {
          lVar18 = 0;
          do {
            uVar3 = renderbuffer.m_size.m_data._0_8_;
            renderbuffer.m_size.m_data._0_8_ = renderbuffer.m_size.m_data._0_8_ & 0xffffffff00000000
            ;
            renderbuffer.m_format.order = R;
            renderbuffer.m_format.type = SNORM_INT8;
            if (info->m_target == 0x8c1a) {
              lVar14 = 0;
              do {
                iVar10 = (info->m_size).m_data[lVar14] >> ((byte)lVar15 & 0x1f);
                if (iVar10 < 2) {
                  iVar10 = 1;
                }
                renderbuffer.m_size.m_data[lVar14 + -2] = iVar10;
                lVar14 = lVar14 + 1;
              } while (lVar14 == 1);
              renderbuffer.m_size.m_data[1] = SUB84(uVar3,4);
              renderbuffer.m_size.m_data[0] = (info->m_size).m_data[2];
            }
            else {
              lVar14 = 0;
              do {
                iVar10 = (info->m_size).m_data[lVar14] >> ((byte)lVar15 & 0x1f);
                if (iVar10 < 2) {
                  iVar10 = 1;
                }
                renderbuffer.m_size.m_data[lVar14 + -2] = iVar10;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
            }
            framebuffer.super_ObjectWrapper.m_traits =
                 (ObjectTraits *)
                 ((ulong)framebuffer.super_ObjectWrapper.m_traits & 0xffffffff00000000);
            framebuffer.super_ObjectWrapper.m_gl = (Functions *)0x0;
            lVar14 = 0;
            do {
              iVar10 = renderbuffer.m_size.m_data[lVar14 + -2];
              iVar2 = *(int *)((long)&__dnew + lVar14 * 4);
              *(uint *)((long)&framebuffer.super_ObjectWrapper.m_gl + lVar14 * 4) =
                   (iVar10 / iVar2 + 1) - (uint)(iVar10 % iVar2 == 0);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            decompressTextureLevel
                      ((TexDecompressionParams *)&res_1,
                       (ArrayBuffer<unsigned_char,_1UL,_1UL> *)
                       (*(long *)((&refRenderbuffer.m_size)[lVar18 * 2 + -1].m_data + 1) +
                       lVar15 * 0x10),
                       (PixelBufferAccess *)
                       (*(long *)((long)&srcBits + lVar18 * 0x18) + lVar15 * 0x28),
                       (CompressedTexFormat *)&res_2,(TextureFormat *)&res_3,(IVec3 *)&renderbuffer,
                       (void *)((long)(iVar7 * (int)lVar18 *
                                       (int)framebuffer.super_ObjectWrapper.m_gl *
                                       framebuffer.super_ObjectWrapper.m_gl._4_4_ *
                                      (int)framebuffer.super_ObjectWrapper.m_traits) +
                               (long)(data->
                                     super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[lVar15].m_ptr));
            lVar18 = lVar18 + 1;
          } while (lVar18 != 6);
          lVar15 = lVar15 + 1;
          iVar10 = getLevelCount(info);
        } while (lVar15 < iVar10);
      }
      lVar15 = 0;
      piVar17 = srcBits.m_data;
      do {
        pFVar12 = *(Functions **)piVar17;
        CVar11 = glu::getCubeFaceFromGL(*(deUint32 *)((long)&DAT_01ccb620 + lVar15));
        (&framebuffer.super_ObjectWrapper.m_gl)[CVar11] = pFVar12;
        lVar15 = lVar15 + 4;
        piVar17 = piVar17 + 6;
      } while (lVar15 != 0x18);
      iVar7 = getLevelCount(info);
      tcu::TextureCubeView::TextureCubeView
                ((TextureCubeView *)&renderbuffer,iVar7,
                 (ConstPixelBufferAccess *(*) [6])&framebuffer);
      renderTextureCubemapView
                (testContext,renderContext,textureRenderer,results,rng,name,info,
                 (TextureCubeView *)&renderbuffer,verify);
      if (this != (ContextInfo *)0x0) {
        (*this->_vptr_ContextInfo[1])();
      }
      lVar15 = 0x78;
      do {
        std::
        vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        ::~vector((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                   *)((long)refRenderbuffer.m_size.m_data + lVar15 + -8));
        lVar15 = lVar15 + -0x18;
      } while (lVar15 != -0x18);
      lVar15 = 0x90;
      do {
        pvVar4 = *(void **)((long)alStack_210 + lVar15);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,*(long *)((long)alStack_210 + lVar15 + 0x10) - (long)pvVar4);
        }
        lVar15 = lVar15 + -0x18;
      } while (lVar15 != 0);
      return;
    }
    getCubeLevelAccesses
              ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
               &srcBits,data,info,0);
    getCubeLevelAccesses
              ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
               (local_1e8 + 8),data,info,1);
    getCubeLevelAccesses(&local_1c8,data,info,2);
    getCubeLevelAccesses(&local_1b0,data,info,3);
    getCubeLevelAccesses(&local_198,data,info,4);
    getCubeLevelAccesses(local_180,data,info,5);
    piVar17 = srcBits.m_data;
    lVar15 = 0;
    do {
      uVar3 = *(undefined8 *)piVar17;
      CVar11 = glu::getCubeFaceFromGL(*(deUint32 *)((long)&DAT_01ccb620 + lVar15));
      *(undefined8 *)(renderbuffer.m_size.m_data + (ulong)CVar11 * 2 + -2) = uVar3;
      lVar15 = lVar15 + 4;
      piVar17 = piVar17 + 6;
    } while (lVar15 != 0x18);
    iVar7 = getLevelCount(info);
    tcu::TextureCubeView::TextureCubeView
              ((TextureCubeView *)&refRenderbuffer,iVar7,
               (ConstPixelBufferAccess *(*) [6])&renderbuffer);
    renderTextureCubemapView
              (testContext,renderContext,textureRenderer,results,rng,name,info,
               (TextureCubeView *)&refRenderbuffer,verify);
    lVar15 = 0x90;
    do {
      pvVar4 = *(void **)((long)alStack_210 + lVar15);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,*(long *)((long)alStack_210 + lVar15 + 0x10) - (long)pvVar4);
      }
      lVar15 = lVar15 + -0x18;
    } while (lVar15 != 0);
    return;
  }
  if (dVar1 == 0x8c1a) {
    bVar6 = glu::isCompressedFormat(info->m_format);
    if (!bVar6) {
      getLevelAccesses((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        *)&srcBits,data,info);
      tcu::Texture2DArrayView::Texture2DArrayView
                ((Texture2DArrayView *)&refRenderbuffer,
                 (int)((ulong)(srcBits.m_data._8_8_ - srcBits.m_data._0_8_) >> 3) * -0x33333333,
                 (ConstPixelBufferAccess *)srcBits.m_data._0_8_);
      renderTexture2DArrayView
                (testContext,renderContext,textureRenderer,results,rng,name,info,
                 (Texture2DArrayView *)&refRenderbuffer,verify);
      goto LAB_0168d21b;
    }
    srcBits.m_data[0] = 0;
    srcBits.m_data[1] = 0;
    srcBits.m_data[2] = 0;
    srcBits.m_data[3] = 0;
    local_1e8._0_8_ = (pointer)0x0;
    refRenderbuffer.m_size.m_data[2] = 0;
    refRenderbuffer.m_pitch.m_data[0] = 0;
    refRenderbuffer.m_format.order = R;
    refRenderbuffer.m_format.type = SNORM_INT8;
    refRenderbuffer.m_size.m_data[0] = 0;
    refRenderbuffer.m_size.m_data[1] = 0;
    decompressTexture((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                       *)&srcBits,
                      (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                      &refRenderbuffer,renderContext,info,data);
    tcu::Texture2DArrayView::Texture2DArrayView
              ((Texture2DArrayView *)&renderbuffer,
               (int)((ulong)(refRenderbuffer.m_size.m_data._0_8_ - (long)refRenderbuffer.m_format)
                    >> 3) * -0x33333333,(ConstPixelBufferAccess *)refRenderbuffer.m_format);
    renderTexture2DArrayView
              (testContext,renderContext,textureRenderer,results,rng,name,info,
               (Texture2DArrayView *)&renderbuffer,verify);
    if (refRenderbuffer.m_format != (TextureFormat)0x0) {
      operator_delete((void *)refRenderbuffer.m_format,
                      refRenderbuffer._16_8_ - (long)refRenderbuffer.m_format);
    }
    goto LAB_0168cd4f;
  }
  if (dVar1 != 0x8d41) {
    return;
  }
  iVar7 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  pFVar12 = (Functions *)CONCAT44(extraout_var,iVar7);
  log = testContext->m_log;
  format = glu::mapGLInternalFormat(info->m_format);
  iVar7 = (info->m_size).m_data[0];
  iVar10 = (info->m_size).m_data[1];
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&refRenderbuffer,&format,iVar7,iVar10,1,
             ((data->
              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->m_ptr);
  TVar8 = tcu::getTextureChannelClass(format.type);
  if (TVar8 < TEXTURECHANNELCLASS_LAST) {
    uVar13 = *(ulong *)(&DAT_01ccb6b0 + (ulong)TVar8 * 8);
    uVar16 = 8;
  }
  else {
    uVar16 = 0x15;
    uVar13 = 0x2600000000;
  }
  readPixelsFormat = (TextureFormat)(uVar13 | uVar16);
  tcu::TextureLevel::TextureLevel(&renderbuffer,&readPixelsFormat,iVar7,iVar10,1);
  traits = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&framebuffer.super_ObjectWrapper,pFVar12,traits);
  (*pFVar12->bindFramebuffer)(0x8d40,framebuffer.super_ObjectWrapper.m_object);
  GVar9 = (*pFVar12->getError)();
  glu::checkError(GVar9,"Failed to create and bind framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x695);
  (*pFVar12->bindRenderbuffer)(0x8d41,name);
  (*pFVar12->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,name);
  GVar9 = (*pFVar12->getError)();
  glu::checkError(GVar9,"Failed to bind and attach renderbuffer to framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x699);
  if (verify != VERIFY_NONE) {
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&srcBits,&renderbuffer);
    glu::readPixels(renderContext,0,0,(PixelBufferAccess *)&srcBits);
  }
  (*pFVar12->bindRenderbuffer)(0x8d41,0);
  (*pFVar12->bindFramebuffer)(0x8d40,0);
  GVar9 = (*pFVar12->getError)();
  glu::checkError(GVar9,"Failed to unbind renderbuffer and framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x6a0);
  glu::ObjectWrapper::~ObjectWrapper(&framebuffer.super_ObjectWrapper);
  if (verify != VERIFY_COMPARE_REFERENCE) goto LAB_0168d88d;
  bVar6 = isFloatFormat(info->m_format);
  srcBits.m_data._0_8_ = log;
  if (bVar6) {
    framebuffer.super_ObjectWrapper.m_gl = (Functions *)0x200000002;
    framebuffer.super_ObjectWrapper.m_traits = (ObjectTraits *)0x200000002;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&srcBits,&renderbuffer);
    bVar6 = tcu::floatUlpThresholdCompare
                      (log,"Image comparison","Image comparison",&refRenderbuffer,
                       (ConstPixelBufferAccess *)&srcBits,(UVec4 *)&framebuffer,COMPARE_LOG_ON_ERROR
                      );
    if (!bVar6) {
      srcBits.m_data._0_8_ = local_1e8;
      __dnew = 0x18;
      srcBits.m_data._0_8_ = std::__cxx11::string::_M_create((ulong *)&srcBits,(ulong)&__dnew);
      local_1e8._0_8_ = __dnew;
      builtin_strncpy((char *)srcBits.m_data._0_8_,"Image comparison failed.",0x18);
      srcBits.m_data[2] = (undefined4)__dnew;
      srcBits.m_data[3] = __dnew._4_4_;
      *(char *)(srcBits.m_data._0_8_ + __dnew) = '\0';
      tcu::ResultCollector::fail(results,(string *)&srcBits);
      goto LAB_0168d870;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(srcBits.m_data + 2));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(srcBits.m_data + 2),"Image comarison passed.",0x17);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&srcBits,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    bVar6 = isIntFormat(info->m_format);
    if ((bVar6) || (bVar6 = isUintFormat(info->m_format), bVar6)) {
      framebuffer.super_ObjectWrapper.m_gl = (Functions *)&DAT_100000001;
      framebuffer.super_ObjectWrapper.m_traits = (ObjectTraits *)&DAT_100000001;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&srcBits,&renderbuffer);
      bVar6 = tcu::intThresholdCompare
                        (log,"Image comparison","Image comparison",&refRenderbuffer,
                         (ConstPixelBufferAccess *)&srcBits,(UVec4 *)&framebuffer,
                         COMPARE_LOG_ON_ERROR);
      if (!bVar6) {
        srcBits.m_data._0_8_ = local_1e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&srcBits,"Image comparison failed.","");
        tcu::ResultCollector::fail(results,(string *)&srcBits);
        goto LAB_0168d870;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(srcBits.m_data + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(srcBits.m_data + 2),"Image comarison passed.",0x17);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&srcBits,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      tcu::getTextureFormatBitDepth((tcu *)&srcBits,&format);
      tcu::getTextureFormatBitDepth((tcu *)&framebuffer,&readPixelsFormat);
      lVar15 = 0;
      do {
        *(undefined4 *)((long)&__dnew + lVar15 * 4) = 0x3f800000;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      lVar15 = 0;
      do {
        aiStack_40[lVar15] = 1;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      res.m_data[0] = 0;
      res.m_data[1] = 0;
      res.m_data[2] = 0;
      res.m_data[3] = 0;
      lVar15 = 0;
      do {
        iVar7 = *(int *)((long)&framebuffer.super_ObjectWrapper.m_gl + lVar15 * 4);
        if (srcBits.m_data[lVar15] < iVar7) {
          iVar7 = srcBits.m_data[lVar15];
        }
        res.m_data[lVar15] = iVar7;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      res_1.m_data[0] = 0;
      res_1.m_data[1] = 0;
      res_1.m_data[2] = 0;
      res_1.m_data[3] = 0;
      lVar15 = 0;
      do {
        res_1.m_data[lVar15] = aiStack_40[lVar15] << ((byte)res.m_data[lVar15] & 0x1f);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      lVar15 = 0;
      do {
        aiStack_50[lVar15] = 1;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      res_2.m_data[0] = 0;
      res_2.m_data[1] = 0;
      res_2.m_data[2] = 0;
      res_2.m_data[3] = 0;
      lVar15 = 0;
      do {
        res_2.m_data[lVar15] = res_1.m_data[lVar15] - aiStack_50[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      res_3.m_data[0] = 0.0;
      res_3.m_data[1] = 0.0;
      res_3.m_data[2] = 0.0;
      res_3.m_data[3] = 0.0;
      lVar15 = 0;
      do {
        res_3.m_data[lVar15] = (float)res_2.m_data[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      threshold_2.m_data[0] = 0.0;
      threshold_2.m_data[1] = 0.0;
      threshold_2.m_data[2] = 0.0;
      threshold_2.m_data[3] = 0.0;
      lVar15 = 0;
      do {
        threshold_2.m_data[lVar15] = *(float *)((long)&__dnew + lVar15 * 4) / res_3.m_data[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&srcBits,&renderbuffer);
      bVar6 = tcu::floatThresholdCompare
                        (log,"Image comparison","Image comparison",&refRenderbuffer,
                         (ConstPixelBufferAccess *)&srcBits,&threshold_2,COMPARE_LOG_ON_ERROR);
      if (!bVar6) {
        srcBits.m_data._0_8_ = local_1e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&srcBits,"Image comparison failed.","");
        tcu::ResultCollector::fail(results,(string *)&srcBits);
LAB_0168d870:
        if ((undefined1 *)srcBits.m_data._0_8_ != local_1e8) {
          operator_delete((void *)srcBits.m_data._0_8_,(ulong)(local_1e8._0_8_ + 1));
        }
        goto LAB_0168d88d;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(srcBits.m_data + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(srcBits.m_data + 2),"Image comarison passed.",0x17);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&srcBits,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(srcBits.m_data + 2));
  std::ios_base::~ios_base((ios_base *)local_180);
LAB_0168d88d:
  tcu::TextureLevel::~TextureLevel(&renderbuffer);
  return;
}

Assistant:

void render (tcu::TestContext&						testContext,
			 glu::RenderContext&					renderContext,
			 TextureRenderer&						textureRenderer,
			 tcu::ResultCollector&					results,
			 de::Random&							rng,
			 deUint32								name,
			 const vector<ArrayBuffer<deUint8> >&	data,
			 const ImageInfo&						info,
			 Verify									verify)
{
	switch (info.getTarget())
	{
		case GL_TEXTURE_2D:
			renderTexture2D(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_TEXTURE_3D:
			renderTexture3D(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_TEXTURE_CUBE_MAP:
			renderTextureCubemap(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_TEXTURE_2D_ARRAY:
			renderTexture2DArray(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_RENDERBUFFER:
			renderRenderbuffer(testContext, renderContext, results, name, data, info, verify);
			break;

		default:
			DE_ASSERT(false);
	}
}